

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_8.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [16];
  byte *pbVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  ulong uVar6;
  bool bVar7;
  char cVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  parasail_result_t *ppVar16;
  __m128i *ptr;
  __m128i *palVar17;
  __m128i *ptr_00;
  int8_t *ptr_01;
  __m128i *ptr_02;
  int32_t t;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  int8_t iVar25;
  char *__format;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong size;
  byte bVar33;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  undefined1 auVar34 [16];
  __m128i alVar35;
  char cVar51;
  ulong uVar52;
  char cVar60;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  char cVar61;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  char cVar85;
  char cVar86;
  char cVar87;
  char cVar88;
  char cVar89;
  char cVar90;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  char cVar109;
  char cVar110;
  char cVar111;
  char cVar112;
  char cVar113;
  char cVar114;
  char cVar115;
  char cVar116;
  char cVar117;
  char cVar118;
  char cVar119;
  char cVar120;
  char cVar121;
  char cVar122;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  char cVar123;
  __m128i vH;
  __m128i vH_00;
  undefined1 local_d8 [16];
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  byte local_98;
  byte bStack_97;
  byte bStack_96;
  byte bStack_95;
  byte bStack_94;
  byte bStack_93;
  byte bStack_92;
  byte bStack_91;
  byte bStack_90;
  byte bStack_8f;
  byte bStack_8e;
  byte bStack_8d;
  byte bStack_8c;
  byte bStack_8b;
  byte bStack_8a;
  byte bStack_89;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  __m128i_8_t e;
  __m128i_8_t h;
  
  uVar29 = (ulong)(uint)s1_beg;
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar18 = "profile";
  }
  else {
    pvVar4 = (profile->profile8).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar18 = "profile->profile8.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar18 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar18 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "open";
        }
        else {
          if (-1 < gap) {
            uVar22 = uVar3 - 1;
            size = (ulong)uVar3 + 0xf >> 4;
            uVar6 = (ulong)uVar22 % size;
            uVar27 = -open;
            uVar19 = ppVar5->min;
            uVar20 = (uint)(byte)-(char)uVar19;
            if (uVar19 != uVar27 && SBORROW4(uVar19,uVar27) == (int)(uVar19 + open) < 0) {
              uVar20 = open;
            }
            iVar15 = ppVar5->max;
            ppVar16 = parasail_result_new_table1((uint)((ulong)uVar3 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              ppVar16->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x10120802;
              ptr = parasail_memalign___m128i(0x10,size);
              palVar17 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar17 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
                iVar12 = s2Len + -1;
                uVar19 = 0xf - (int)(uVar22 / size);
                auVar53 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
                auVar54 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
                bVar11 = (char)uVar20 + 0x81;
                auVar55 = pshufb(ZEXT116(bVar11),(undefined1  [16])0x0);
                auVar56 = pshufb(ZEXT116((byte)(0x7e - (char)iVar15)),(undefined1  [16])0x0);
                auVar57 = pshufb(ZEXT416(uVar19),(undefined1  [16])0x0);
                lVar21 = (long)(int)uVar27;
                for (uVar26 = 0; uVar26 != size; uVar26 = uVar26 + 1) {
                  lVar28 = lVar21;
                  for (lVar30 = 0; lVar30 != 0x10; lVar30 = lVar30 + 1) {
                    lVar31 = lVar28;
                    if (s1_beg != 0) {
                      lVar31 = 0;
                    }
                    lVar23 = -0x80;
                    if (-0x80 < lVar31) {
                      lVar23 = lVar31;
                    }
                    lVar32 = lVar31 - (ulong)(uint)open;
                    if ((long)(lVar31 - (ulong)(uint)open) < -0x7f) {
                      lVar32 = -0x80;
                    }
                    h.v[lVar30] = (int8_t)lVar23;
                    e.v[lVar30] = (int8_t)lVar32;
                    lVar28 = lVar28 - size * (uint)gap;
                  }
                  uVar29 = uVar26 * 0x10;
                  ptr[uVar26][0] = h.m[0];
                  ptr[uVar26][1] = h.m[1];
                  ptr_00[uVar26][0] = e.m[0];
                  ptr_00[uVar26][1] = e.m[1];
                  lVar21 = lVar21 - (ulong)(uint)gap;
                }
                *ptr_01 = '\0';
                uVar20 = uVar27;
                for (uVar26 = 1; s2Len + 1 != uVar26; uVar26 = uVar26 + 1) {
                  iVar25 = -0x80;
                  if (-0x80 < (int)uVar20) {
                    iVar25 = (int8_t)uVar20;
                  }
                  if (s2_beg != 0) {
                    iVar25 = '\0';
                  }
                  ptr_01[uVar26] = iVar25;
                  uVar20 = uVar20 - gap;
                }
                uVar20 = (uint)size;
                uVar26 = 0;
                local_d8[0] = auVar57[0];
                local_d8[1] = auVar57[1];
                local_d8[2] = auVar57[2];
                local_d8[3] = auVar57[3];
                local_d8[4] = auVar57[4];
                local_d8[5] = auVar57[5];
                local_d8[6] = auVar57[6];
                local_d8[7] = auVar57[7];
                local_d8[8] = auVar57[8];
                local_d8[9] = auVar57[9];
                local_d8[10] = auVar57[10];
                local_d8[0xb] = auVar57[0xb];
                local_d8[0xc] = auVar57[0xc];
                local_d8[0xd] = auVar57[0xd];
                local_d8[0xe] = auVar57[0xe];
                local_d8[0xf] = auVar57[0xf];
                local_d8[1] = -(local_d8[1] == '\x0e');
                local_d8[0] = -(local_d8[0] == '\x0f');
                local_d8[2] = -(local_d8[2] == '\r');
                local_d8[3] = -(local_d8[3] == '\f');
                local_d8[4] = -(local_d8[4] == '\v');
                local_d8[5] = -(local_d8[5] == '\n');
                local_d8[6] = -(local_d8[6] == '\t');
                local_d8[7] = -(local_d8[7] == '\b');
                local_d8[8] = -(local_d8[8] == '\a');
                local_d8[9] = -(local_d8[9] == '\x06');
                local_d8[10] = -(local_d8[10] == '\x05');
                local_d8[0xb] = -(local_d8[0xb] == '\x04');
                local_d8[0xc] = -(local_d8[0xc] == '\x03');
                local_d8[0xd] = -(local_d8[0xd] == '\x02');
                local_d8[0xe] = -(local_d8[0xe] == '\x01');
                local_d8[0xf] = -(local_d8[0xf] == '\0');
                local_98 = auVar56[0];
                bStack_97 = auVar56[1];
                bStack_96 = auVar56[2];
                bStack_95 = auVar56[3];
                bStack_94 = auVar56[4];
                bStack_93 = auVar56[5];
                bStack_92 = auVar56[6];
                bStack_91 = auVar56[7];
                bStack_90 = auVar56[8];
                bStack_8f = auVar56[9];
                bStack_8e = auVar56[10];
                bStack_8d = auVar56[0xb];
                bStack_8c = auVar56[0xc];
                bStack_8b = auVar56[0xd];
                bStack_8a = auVar56[0xe];
                bStack_89 = auVar56[0xf];
                auVar57 = auVar55;
                auVar56 = auVar55;
                iVar15 = iVar12;
                bVar91 = local_98;
                bVar92 = bStack_97;
                bVar93 = bStack_96;
                bVar94 = bStack_95;
                bVar95 = bStack_94;
                bVar96 = bStack_93;
                bVar97 = bStack_92;
                bVar98 = bStack_91;
                bVar99 = bStack_90;
                bVar100 = bStack_8f;
                bVar101 = bStack_8e;
                bVar102 = bStack_8d;
                bVar103 = bStack_8c;
                bVar104 = bStack_8b;
                bVar105 = bStack_8a;
                bVar106 = bStack_89;
                do {
                  ptr_02 = palVar17;
                  if (uVar26 == (uint)s2Len) {
                    if (s2_end != 0) {
                      iVar14 = 0;
                      while( true ) {
                        uVar29 = auVar57._0_8_;
                        lVar21 = auVar57._8_8_;
                        if ((int)uVar19 <= iVar14) break;
                        auVar57._0_8_ = uVar29 << 8;
                        auVar57._8_8_ = lVar21 << 8 | uVar29 >> 0x38;
                        iVar14 = iVar14 + 1;
                      }
                      bVar11 = auVar57[0xf];
                    }
                    uVar27 = uVar22;
                    if (s1_end != 0) {
                      for (uVar29 = 0; (uVar20 & 0x7ffffff) << 4 != (uint)uVar29;
                          uVar29 = uVar29 + 1) {
                        uVar13 = ((uint)uVar29 & 0xf) * uVar20 + ((uint)(uVar29 >> 4) & 0xfffffff);
                        iVar14 = iVar15;
                        uVar10 = uVar27;
                        bVar33 = bVar11;
                        if (((int)uVar13 < (int)uVar3) &&
                           (bVar36 = *(byte *)((long)*ptr + uVar29), iVar14 = iVar12,
                           uVar10 = uVar13, bVar33 = bVar36, (char)bVar36 <= (char)bVar11)) {
                          if ((int)uVar27 <= (int)uVar13) {
                            uVar13 = uVar27;
                          }
                          if (iVar15 != iVar12) {
                            uVar13 = uVar27;
                          }
                          iVar14 = iVar15;
                          uVar10 = uVar27;
                          bVar33 = bVar11;
                          if (bVar36 == bVar11) {
                            uVar10 = uVar13;
                          }
                        }
                        bVar11 = bVar33;
                        uVar27 = uVar10;
                        iVar15 = iVar14;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar35 = ptr[uVar6];
                      iVar15 = 0;
                      while( true ) {
                        uVar29 = alVar35[0];
                        lVar21 = alVar35[1];
                        if ((int)uVar19 <= iVar15) break;
                        alVar35[0] = uVar29 << 8;
                        alVar35[1] = lVar21 << 8 | uVar29 >> 0x38;
                        iVar15 = iVar15 + 1;
                      }
                      bVar11 = alVar35[1]._7_1_;
                      iVar15 = iVar12;
                      uVar27 = uVar22;
                    }
                    local_c8 = auVar55[0];
                    cStack_c7 = auVar55[1];
                    cStack_c6 = auVar55[2];
                    cStack_c5 = auVar55[3];
                    cStack_c4 = auVar55[4];
                    cStack_c3 = auVar55[5];
                    cStack_c2 = auVar55[6];
                    cStack_c1 = auVar55[7];
                    cStack_c0 = auVar55[8];
                    cStack_bf = auVar55[9];
                    cStack_be = auVar55[10];
                    cStack_bd = auVar55[0xb];
                    cStack_bc = auVar55[0xc];
                    cStack_bb = auVar55[0xd];
                    cStack_ba = auVar55[0xe];
                    cStack_b9 = auVar55[0xf];
                    auVar53[0] = -((char)bVar91 < local_c8);
                    auVar53[1] = -((char)bVar92 < cStack_c7);
                    auVar53[2] = -((char)bVar93 < cStack_c6);
                    auVar53[3] = -((char)bVar94 < cStack_c5);
                    auVar53[4] = -((char)bVar95 < cStack_c4);
                    auVar53[5] = -((char)bVar96 < cStack_c3);
                    auVar53[6] = -((char)bVar97 < cStack_c2);
                    auVar53[7] = -((char)bVar98 < cStack_c1);
                    auVar53[8] = -((char)bVar99 < cStack_c0);
                    auVar53[9] = -((char)bVar100 < cStack_bf);
                    auVar53[10] = -((char)bVar101 < cStack_be);
                    auVar53[0xb] = -((char)bVar102 < cStack_bd);
                    auVar53[0xc] = -((char)bVar103 < cStack_bc);
                    auVar53[0xd] = -((char)bVar104 < cStack_bb);
                    auVar53[0xe] = -((char)bVar105 < cStack_ba);
                    auVar53[0xf] = -((char)bVar106 < cStack_b9);
                    auVar54[0] = -((char)local_98 < auVar56[0]);
                    auVar54[1] = -((char)bStack_97 < auVar56[1]);
                    auVar54[2] = -((char)bStack_96 < auVar56[2]);
                    auVar54[3] = -((char)bStack_95 < auVar56[3]);
                    auVar54[4] = -((char)bStack_94 < auVar56[4]);
                    auVar54[5] = -((char)bStack_93 < auVar56[5]);
                    auVar54[6] = -((char)bStack_92 < auVar56[6]);
                    auVar54[7] = -((char)bStack_91 < auVar56[7]);
                    auVar54[8] = -((char)bStack_90 < auVar56[8]);
                    auVar54[9] = -((char)bStack_8f < auVar56[9]);
                    auVar54[10] = -((char)bStack_8e < auVar56[10]);
                    auVar54[0xb] = -((char)bStack_8d < auVar56[0xb]);
                    auVar54[0xc] = -((char)bStack_8c < auVar56[0xc]);
                    auVar54[0xd] = -((char)bStack_8b < auVar56[0xd]);
                    auVar54[0xe] = -((char)bStack_8a < auVar56[0xe]);
                    auVar54[0xf] = -((char)bStack_89 < auVar56[0xf]);
                    auVar54 = auVar54 | auVar53;
                    if ((((((((((((((((auVar54 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar54 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar54 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar54 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar54 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar54 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar54 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar54 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar54 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar54 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar54 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar54 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar54 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar54[0xf] < '\0') {
                      *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                      bVar11 = 0;
                      iVar15 = 0;
                      uVar27 = 0;
                    }
                    ppVar16->score = (int)(char)bVar11;
                    ppVar16->end_query = uVar27;
                    ppVar16->end_ref = iVar15;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr);
                    return ppVar16;
                  }
                  uVar24 = ptr[uVar20 - 1][0];
                  auVar108._8_8_ = ptr[uVar20 - 1][1] << 8 | uVar24 >> 0x38;
                  iVar14 = ppVar5->mapper[(byte)s2[uVar26]];
                  auVar108._0_8_ = uVar24 << 8 | (ulong)(byte)ptr_01[uVar26];
                  lVar21 = 0;
                  auVar58 = auVar55;
                  for (uVar24 = 0; t = (int32_t)uVar26, size != uVar24; uVar24 = uVar24 + 1) {
                    auVar107 = paddsb(auVar108,*(undefined1 (*) [16])
                                                ((long)pvVar4 +
                                                lVar21 + (long)(int)(iVar14 * uVar20) * 0x10));
                    pauVar1 = (undefined1 (*) [16])((long)*ptr_00 + lVar21);
                    cVar109 = (*pauVar1)[0];
                    cVar110 = (*pauVar1)[1];
                    cVar111 = (*pauVar1)[2];
                    cVar112 = (*pauVar1)[3];
                    cVar113 = (*pauVar1)[4];
                    cVar114 = (*pauVar1)[5];
                    cVar115 = (*pauVar1)[6];
                    cVar116 = (*pauVar1)[7];
                    cVar117 = (*pauVar1)[8];
                    cVar118 = (*pauVar1)[9];
                    cVar119 = (*pauVar1)[10];
                    cVar120 = (*pauVar1)[0xb];
                    cVar121 = (*pauVar1)[0xc];
                    cVar122 = (*pauVar1)[0xd];
                    cVar123 = (*pauVar1)[0xe];
                    cVar8 = (*pauVar1)[0xf];
                    auVar108 = *pauVar1;
                    cVar60 = auVar58[0];
                    bVar33 = (cVar109 < cVar60) * cVar60 | (cVar109 >= cVar60) * cVar109;
                    cVar64 = auVar58[1];
                    bVar36 = (cVar110 < cVar64) * cVar64 | (cVar110 >= cVar64) * cVar110;
                    cVar66 = auVar58[2];
                    bVar37 = (cVar111 < cVar66) * cVar66 | (cVar111 >= cVar66) * cVar111;
                    cVar68 = auVar58[3];
                    bVar38 = (cVar112 < cVar68) * cVar68 | (cVar112 >= cVar68) * cVar112;
                    cVar70 = auVar58[4];
                    bVar39 = (cVar113 < cVar70) * cVar70 | (cVar113 >= cVar70) * cVar113;
                    cVar72 = auVar58[5];
                    bVar40 = (cVar114 < cVar72) * cVar72 | (cVar114 >= cVar72) * cVar114;
                    cVar74 = auVar58[6];
                    bVar41 = (cVar115 < cVar74) * cVar74 | (cVar115 >= cVar74) * cVar115;
                    cVar76 = auVar58[7];
                    bVar42 = (cVar116 < cVar76) * cVar76 | (cVar116 >= cVar76) * cVar116;
                    cVar78 = auVar58[8];
                    bVar43 = (cVar117 < cVar78) * cVar78 | (cVar117 >= cVar78) * cVar117;
                    cVar80 = auVar58[9];
                    bVar44 = (cVar118 < cVar80) * cVar80 | (cVar118 >= cVar80) * cVar118;
                    cVar82 = auVar58[10];
                    bVar45 = (cVar119 < cVar82) * cVar82 | (cVar119 >= cVar82) * cVar119;
                    cVar84 = auVar58[0xb];
                    bVar46 = (cVar120 < cVar84) * cVar84 | (cVar120 >= cVar84) * cVar120;
                    cVar86 = auVar58[0xc];
                    bVar47 = (cVar121 < cVar86) * cVar86 | (cVar121 >= cVar86) * cVar121;
                    cVar88 = auVar58[0xd];
                    bVar48 = (cVar122 < cVar88) * cVar88 | (cVar122 >= cVar88) * cVar122;
                    cVar90 = auVar58[0xe];
                    bVar49 = (cVar123 < cVar90) * cVar90 | (cVar123 >= cVar90) * cVar123;
                    cVar51 = auVar58[0xf];
                    bVar50 = (cVar8 < cVar51) * cVar51 | (cVar8 >= cVar51) * cVar8;
                    cVar61 = auVar107[0];
                    bVar33 = ((char)bVar33 < cVar61) * cVar61 | ((char)bVar33 >= cVar61) * bVar33;
                    cVar61 = auVar107[1];
                    bVar36 = ((char)bVar36 < cVar61) * cVar61 | ((char)bVar36 >= cVar61) * bVar36;
                    cVar61 = auVar107[2];
                    bVar37 = ((char)bVar37 < cVar61) * cVar61 | ((char)bVar37 >= cVar61) * bVar37;
                    cVar61 = auVar107[3];
                    bVar38 = ((char)bVar38 < cVar61) * cVar61 | ((char)bVar38 >= cVar61) * bVar38;
                    cVar61 = auVar107[4];
                    bVar39 = ((char)bVar39 < cVar61) * cVar61 | ((char)bVar39 >= cVar61) * bVar39;
                    cVar61 = auVar107[5];
                    bVar40 = ((char)bVar40 < cVar61) * cVar61 | ((char)bVar40 >= cVar61) * bVar40;
                    cVar61 = auVar107[6];
                    bVar41 = ((char)bVar41 < cVar61) * cVar61 | ((char)bVar41 >= cVar61) * bVar41;
                    cVar61 = auVar107[7];
                    bVar42 = ((char)bVar42 < cVar61) * cVar61 | ((char)bVar42 >= cVar61) * bVar42;
                    cVar61 = auVar107[8];
                    bVar43 = ((char)bVar43 < cVar61) * cVar61 | ((char)bVar43 >= cVar61) * bVar43;
                    cVar61 = auVar107[9];
                    bVar44 = ((char)bVar44 < cVar61) * cVar61 | ((char)bVar44 >= cVar61) * bVar44;
                    cVar61 = auVar107[10];
                    bVar45 = ((char)bVar45 < cVar61) * cVar61 | ((char)bVar45 >= cVar61) * bVar45;
                    cVar61 = auVar107[0xb];
                    bVar46 = ((char)bVar46 < cVar61) * cVar61 | ((char)bVar46 >= cVar61) * bVar46;
                    cVar61 = auVar107[0xc];
                    bVar47 = ((char)bVar47 < cVar61) * cVar61 | ((char)bVar47 >= cVar61) * bVar47;
                    cVar61 = auVar107[0xd];
                    bVar48 = ((char)bVar48 < cVar61) * cVar61 | ((char)bVar48 >= cVar61) * bVar48;
                    cVar61 = auVar107[0xe];
                    bVar49 = ((char)bVar49 < cVar61) * cVar61 | ((char)bVar49 >= cVar61) * bVar49;
                    cVar61 = auVar107[0xf];
                    bVar50 = ((char)bVar50 < cVar61) * cVar61 | ((char)bVar50 >= cVar61) * bVar50;
                    pbVar2 = (byte *)((long)*ptr_02 + lVar21);
                    *pbVar2 = bVar33;
                    pbVar2[1] = bVar36;
                    pbVar2[2] = bVar37;
                    pbVar2[3] = bVar38;
                    pbVar2[4] = bVar39;
                    pbVar2[5] = bVar40;
                    pbVar2[6] = bVar41;
                    pbVar2[7] = bVar42;
                    pbVar2[8] = bVar43;
                    pbVar2[9] = bVar44;
                    pbVar2[10] = bVar45;
                    pbVar2[0xb] = bVar46;
                    pbVar2[0xc] = bVar47;
                    pbVar2[0xd] = bVar48;
                    pbVar2[0xe] = bVar49;
                    pbVar2[0xf] = bVar50;
                    cVar61 = auVar56[0];
                    cVar62 = auVar56[1];
                    cVar63 = auVar56[2];
                    cVar65 = auVar56[3];
                    cVar67 = auVar56[4];
                    cVar69 = auVar56[5];
                    cVar71 = auVar56[6];
                    cVar73 = auVar56[7];
                    cVar75 = auVar56[8];
                    cVar77 = auVar56[9];
                    cVar79 = auVar56[10];
                    cVar81 = auVar56[0xb];
                    cVar83 = auVar56[0xc];
                    cVar85 = auVar56[0xd];
                    cVar87 = auVar56[0xe];
                    cVar89 = auVar56[0xf];
                    bVar91 = (cVar109 < (char)bVar91) * cVar109 | (cVar109 >= (char)bVar91) * bVar91
                    ;
                    bVar92 = (cVar110 < (char)bVar92) * cVar110 | (cVar110 >= (char)bVar92) * bVar92
                    ;
                    bVar93 = (cVar111 < (char)bVar93) * cVar111 | (cVar111 >= (char)bVar93) * bVar93
                    ;
                    bVar94 = (cVar112 < (char)bVar94) * cVar112 | (cVar112 >= (char)bVar94) * bVar94
                    ;
                    bVar95 = (cVar113 < (char)bVar95) * cVar113 | (cVar113 >= (char)bVar95) * bVar95
                    ;
                    bVar96 = (cVar114 < (char)bVar96) * cVar114 | (cVar114 >= (char)bVar96) * bVar96
                    ;
                    bVar97 = (cVar115 < (char)bVar97) * cVar115 | (cVar115 >= (char)bVar97) * bVar97
                    ;
                    bVar98 = (cVar116 < (char)bVar98) * cVar116 | (cVar116 >= (char)bVar98) * bVar98
                    ;
                    bVar99 = (cVar117 < (char)bVar99) * cVar117 | (cVar117 >= (char)bVar99) * bVar99
                    ;
                    bVar100 = (cVar118 < (char)bVar100) * cVar118 |
                              (cVar118 >= (char)bVar100) * bVar100;
                    bVar101 = (cVar119 < (char)bVar101) * cVar119 |
                              (cVar119 >= (char)bVar101) * bVar101;
                    bVar102 = (cVar120 < (char)bVar102) * cVar120 |
                              (cVar120 >= (char)bVar102) * bVar102;
                    bVar103 = (cVar121 < (char)bVar103) * cVar121 |
                              (cVar121 >= (char)bVar103) * bVar103;
                    bVar104 = (cVar122 < (char)bVar104) * cVar122 |
                              (cVar122 >= (char)bVar104) * bVar104;
                    bVar105 = (cVar123 < (char)bVar105) * cVar123 |
                              (cVar123 >= (char)bVar105) * bVar105;
                    bVar106 = (cVar8 < (char)bVar106) * cVar8 | (cVar8 >= (char)bVar106) * bVar106;
                    bVar91 = (cVar60 < (char)bVar91) * cVar60 | (cVar60 >= (char)bVar91) * bVar91;
                    bVar92 = (cVar64 < (char)bVar92) * cVar64 | (cVar64 >= (char)bVar92) * bVar92;
                    bVar93 = (cVar66 < (char)bVar93) * cVar66 | (cVar66 >= (char)bVar93) * bVar93;
                    bVar94 = (cVar68 < (char)bVar94) * cVar68 | (cVar68 >= (char)bVar94) * bVar94;
                    bVar95 = (cVar70 < (char)bVar95) * cVar70 | (cVar70 >= (char)bVar95) * bVar95;
                    bVar96 = (cVar72 < (char)bVar96) * cVar72 | (cVar72 >= (char)bVar96) * bVar96;
                    bVar97 = (cVar74 < (char)bVar97) * cVar74 | (cVar74 >= (char)bVar97) * bVar97;
                    bVar98 = (cVar76 < (char)bVar98) * cVar76 | (cVar76 >= (char)bVar98) * bVar98;
                    bVar99 = (cVar78 < (char)bVar99) * cVar78 | (cVar78 >= (char)bVar99) * bVar99;
                    bVar100 = (cVar80 < (char)bVar100) * cVar80 |
                              (cVar80 >= (char)bVar100) * bVar100;
                    bVar101 = (cVar82 < (char)bVar101) * cVar82 |
                              (cVar82 >= (char)bVar101) * bVar101;
                    bVar102 = (cVar84 < (char)bVar102) * cVar84 |
                              (cVar84 >= (char)bVar102) * bVar102;
                    bVar103 = (cVar86 < (char)bVar103) * cVar86 |
                              (cVar86 >= (char)bVar103) * bVar103;
                    bVar104 = (cVar88 < (char)bVar104) * cVar88 |
                              (cVar88 >= (char)bVar104) * bVar104;
                    bVar105 = (cVar90 < (char)bVar105) * cVar90 |
                              (cVar90 >= (char)bVar105) * bVar105;
                    bVar106 = (cVar51 < (char)bVar106) * cVar51 |
                              (cVar51 >= (char)bVar106) * bVar106;
                    bVar91 = ((char)bVar33 < (char)bVar91) * bVar33 |
                             ((char)bVar33 >= (char)bVar91) * bVar91;
                    bVar92 = ((char)bVar36 < (char)bVar92) * bVar36 |
                             ((char)bVar36 >= (char)bVar92) * bVar92;
                    bVar93 = ((char)bVar37 < (char)bVar93) * bVar37 |
                             ((char)bVar37 >= (char)bVar93) * bVar93;
                    bVar94 = ((char)bVar38 < (char)bVar94) * bVar38 |
                             ((char)bVar38 >= (char)bVar94) * bVar94;
                    bVar95 = ((char)bVar39 < (char)bVar95) * bVar39 |
                             ((char)bVar39 >= (char)bVar95) * bVar95;
                    bVar96 = ((char)bVar40 < (char)bVar96) * bVar40 |
                             ((char)bVar40 >= (char)bVar96) * bVar96;
                    bVar97 = ((char)bVar41 < (char)bVar97) * bVar41 |
                             ((char)bVar41 >= (char)bVar97) * bVar97;
                    bVar98 = ((char)bVar42 < (char)bVar98) * bVar42 |
                             ((char)bVar42 >= (char)bVar98) * bVar98;
                    bVar99 = ((char)bVar43 < (char)bVar99) * bVar43 |
                             ((char)bVar43 >= (char)bVar99) * bVar99;
                    bVar100 = ((char)bVar44 < (char)bVar100) * bVar44 |
                              ((char)bVar44 >= (char)bVar100) * bVar100;
                    bVar101 = ((char)bVar45 < (char)bVar101) * bVar45 |
                              ((char)bVar45 >= (char)bVar101) * bVar101;
                    bVar102 = ((char)bVar46 < (char)bVar102) * bVar46 |
                              ((char)bVar46 >= (char)bVar102) * bVar102;
                    bVar103 = ((char)bVar47 < (char)bVar103) * bVar47 |
                              ((char)bVar47 >= (char)bVar103) * bVar103;
                    bVar104 = ((char)bVar48 < (char)bVar104) * bVar48 |
                              ((char)bVar48 >= (char)bVar104) * bVar104;
                    bVar105 = ((char)bVar49 < (char)bVar105) * bVar49 |
                              ((char)bVar49 >= (char)bVar105) * bVar105;
                    bVar106 = ((char)bVar50 < (char)bVar106) * bVar50 |
                              ((char)bVar50 >= (char)bVar106) * bVar106;
                    vH[0] = uVar24 & 0xffffffff;
                    vH[1] = size;
                    arr_store_si128(((ppVar16->field_4).rowcols)->score_row,vH,t,s2Len,
                                    (int32_t)uVar29,(int32_t)ptr);
                    auVar56[1] = (cVar62 < (char)bVar36) * bVar36 |
                                 (cVar62 >= (char)bVar36) * cVar62;
                    auVar56[0] = (cVar61 < (char)bVar33) * bVar33 |
                                 (cVar61 >= (char)bVar33) * cVar61;
                    auVar56[2] = (cVar63 < (char)bVar37) * bVar37 |
                                 (cVar63 >= (char)bVar37) * cVar63;
                    auVar56[3] = (cVar65 < (char)bVar38) * bVar38 |
                                 (cVar65 >= (char)bVar38) * cVar65;
                    auVar56[4] = (cVar67 < (char)bVar39) * bVar39 |
                                 (cVar67 >= (char)bVar39) * cVar67;
                    auVar56[5] = (cVar69 < (char)bVar40) * bVar40 |
                                 (cVar69 >= (char)bVar40) * cVar69;
                    auVar56[6] = (cVar71 < (char)bVar41) * bVar41 |
                                 (cVar71 >= (char)bVar41) * cVar71;
                    auVar56[7] = (cVar73 < (char)bVar42) * bVar42 |
                                 (cVar73 >= (char)bVar42) * cVar73;
                    auVar56[8] = (cVar75 < (char)bVar43) * bVar43 |
                                 (cVar75 >= (char)bVar43) * cVar75;
                    auVar56[9] = (cVar77 < (char)bVar44) * bVar44 |
                                 (cVar77 >= (char)bVar44) * cVar77;
                    auVar56[10] = (cVar79 < (char)bVar45) * bVar45 |
                                  (cVar79 >= (char)bVar45) * cVar79;
                    auVar56[0xb] = (cVar81 < (char)bVar46) * bVar46 |
                                   (cVar81 >= (char)bVar46) * cVar81;
                    auVar56[0xc] = (cVar83 < (char)bVar47) * bVar47 |
                                   (cVar83 >= (char)bVar47) * cVar83;
                    auVar56[0xd] = (cVar85 < (char)bVar48) * bVar48 |
                                   (cVar85 >= (char)bVar48) * cVar85;
                    auVar56[0xe] = (cVar87 < (char)bVar49) * bVar49 |
                                   (cVar87 >= (char)bVar49) * cVar87;
                    auVar56[0xf] = (cVar89 < (char)bVar50) * bVar50 |
                                   (cVar89 >= (char)bVar50) * cVar89;
                    auVar107[1] = bVar36;
                    auVar107[0] = bVar33;
                    auVar107[2] = bVar37;
                    auVar107[3] = bVar38;
                    auVar107[4] = bVar39;
                    auVar107[5] = bVar40;
                    auVar107[6] = bVar41;
                    auVar107[7] = bVar42;
                    auVar107[8] = bVar43;
                    auVar107[9] = bVar44;
                    auVar107[10] = bVar45;
                    auVar107[0xb] = bVar46;
                    auVar107[0xc] = bVar47;
                    auVar107[0xd] = bVar48;
                    auVar107[0xe] = bVar49;
                    auVar107[0xf] = bVar50;
                    auVar107 = psubsb(auVar107,auVar53);
                    auVar108 = psubsb(auVar108,auVar54);
                    cVar60 = auVar107[0];
                    cVar51 = auVar108[0];
                    cVar61 = auVar107[1];
                    cVar109 = auVar108[1];
                    cVar64 = auVar107[2];
                    cVar110 = auVar108[2];
                    cVar66 = auVar107[3];
                    cVar111 = auVar108[3];
                    cVar68 = auVar107[4];
                    cVar112 = auVar108[4];
                    cVar70 = auVar107[5];
                    cVar113 = auVar108[5];
                    cVar72 = auVar107[6];
                    cVar114 = auVar108[6];
                    cVar74 = auVar107[7];
                    cVar115 = auVar108[7];
                    cVar76 = auVar107[8];
                    cVar116 = auVar108[8];
                    cVar78 = auVar107[9];
                    cVar117 = auVar108[9];
                    cVar80 = auVar107[10];
                    cVar118 = auVar108[10];
                    cVar82 = auVar107[0xb];
                    cVar119 = auVar108[0xb];
                    cVar84 = auVar107[0xc];
                    cVar120 = auVar108[0xc];
                    cVar86 = auVar107[0xd];
                    cVar121 = auVar108[0xd];
                    cVar88 = auVar107[0xe];
                    cVar122 = auVar108[0xe];
                    cVar123 = auVar108[0xf];
                    cVar90 = auVar107[0xf];
                    pbVar2 = (byte *)((long)*ptr_00 + lVar21);
                    *pbVar2 = (cVar51 < cVar60) * cVar60 | (cVar51 >= cVar60) * cVar51;
                    pbVar2[1] = (cVar109 < cVar61) * cVar61 | (cVar109 >= cVar61) * cVar109;
                    pbVar2[2] = (cVar110 < cVar64) * cVar64 | (cVar110 >= cVar64) * cVar110;
                    pbVar2[3] = (cVar111 < cVar66) * cVar66 | (cVar111 >= cVar66) * cVar111;
                    pbVar2[4] = (cVar112 < cVar68) * cVar68 | (cVar112 >= cVar68) * cVar112;
                    pbVar2[5] = (cVar113 < cVar70) * cVar70 | (cVar113 >= cVar70) * cVar113;
                    pbVar2[6] = (cVar114 < cVar72) * cVar72 | (cVar114 >= cVar72) * cVar114;
                    pbVar2[7] = (cVar115 < cVar74) * cVar74 | (cVar115 >= cVar74) * cVar115;
                    pbVar2[8] = (cVar116 < cVar76) * cVar76 | (cVar116 >= cVar76) * cVar116;
                    pbVar2[9] = (cVar117 < cVar78) * cVar78 | (cVar117 >= cVar78) * cVar117;
                    pbVar2[10] = (cVar118 < cVar80) * cVar80 | (cVar118 >= cVar80) * cVar118;
                    pbVar2[0xb] = (cVar119 < cVar82) * cVar82 | (cVar119 >= cVar82) * cVar119;
                    pbVar2[0xc] = (cVar120 < cVar84) * cVar84 | (cVar120 >= cVar84) * cVar120;
                    pbVar2[0xd] = (cVar121 < cVar86) * cVar86 | (cVar121 >= cVar86) * cVar121;
                    pbVar2[0xe] = (cVar122 < cVar88) * cVar88 | (cVar122 >= cVar88) * cVar122;
                    pbVar2[0xf] = (cVar123 < cVar90) * cVar90 | (cVar123 >= cVar90) * cVar123;
                    auVar108 = psubsb(auVar58,auVar54);
                    cVar51 = auVar108[0];
                    auVar58[0] = (cVar51 < cVar60) * cVar60 | (cVar51 >= cVar60) * cVar51;
                    cVar60 = auVar108[1];
                    auVar58[1] = (cVar60 < cVar61) * cVar61 | (cVar60 >= cVar61) * cVar60;
                    cVar60 = auVar108[2];
                    auVar58[2] = (cVar60 < cVar64) * cVar64 | (cVar60 >= cVar64) * cVar60;
                    cVar60 = auVar108[3];
                    auVar58[3] = (cVar60 < cVar66) * cVar66 | (cVar60 >= cVar66) * cVar60;
                    cVar60 = auVar108[4];
                    auVar58[4] = (cVar60 < cVar68) * cVar68 | (cVar60 >= cVar68) * cVar60;
                    cVar60 = auVar108[5];
                    auVar58[5] = (cVar60 < cVar70) * cVar70 | (cVar60 >= cVar70) * cVar60;
                    cVar60 = auVar108[6];
                    auVar58[6] = (cVar60 < cVar72) * cVar72 | (cVar60 >= cVar72) * cVar60;
                    cVar60 = auVar108[7];
                    auVar58[7] = (cVar60 < cVar74) * cVar74 | (cVar60 >= cVar74) * cVar60;
                    cVar60 = auVar108[8];
                    auVar58[8] = (cVar60 < cVar76) * cVar76 | (cVar60 >= cVar76) * cVar60;
                    cVar60 = auVar108[9];
                    auVar58[9] = (cVar60 < cVar78) * cVar78 | (cVar60 >= cVar78) * cVar60;
                    cVar60 = auVar108[10];
                    auVar58[10] = (cVar60 < cVar80) * cVar80 | (cVar60 >= cVar80) * cVar60;
                    cVar60 = auVar108[0xb];
                    auVar58[0xb] = (cVar60 < cVar82) * cVar82 | (cVar60 >= cVar82) * cVar60;
                    cVar60 = auVar108[0xc];
                    auVar58[0xc] = (cVar60 < cVar84) * cVar84 | (cVar60 >= cVar84) * cVar60;
                    cVar60 = auVar108[0xd];
                    auVar58[0xd] = (cVar60 < cVar86) * cVar86 | (cVar60 >= cVar86) * cVar60;
                    cVar60 = auVar108[0xe];
                    cVar61 = auVar108[0xf];
                    auVar58[0xe] = (cVar60 < cVar88) * cVar88 | (cVar60 >= cVar88) * cVar60;
                    auVar58[0xf] = (cVar61 < cVar90) * cVar90 | (cVar61 >= cVar90) * cVar61;
                    auVar108 = *(undefined1 (*) [16])((long)*ptr + lVar21);
                    lVar21 = lVar21 + 0x10;
                  }
                  for (iVar14 = 0; iVar14 != 0x10; iVar14 = iVar14 + 1) {
                    uVar13 = uVar27;
                    if (s2_beg == 0) {
                      uVar13 = ptr_01[uVar26 + 1] - open;
                    }
                    uVar24 = (ulong)uVar13;
                    if ((int)uVar13 < -0x7f) {
                      uVar24 = 0xffffff80;
                    }
                    uVar52 = auVar58._0_8_;
                    auVar58._8_8_ = auVar58._8_8_ << 8 | uVar52 >> 0x38;
                    auVar58._0_8_ = uVar52 << 8 | uVar24 & 0xff;
                    uVar24 = 0;
                    palVar17 = ptr_02;
                    while (size != uVar24) {
                      cVar61 = (char)(*palVar17)[0];
                      cVar64 = *(char *)((long)*palVar17 + 1);
                      cVar66 = *(char *)((long)*palVar17 + 2);
                      cVar68 = *(char *)((long)*palVar17 + 3);
                      cVar70 = *(char *)((long)*palVar17 + 4);
                      cVar72 = *(char *)((long)*palVar17 + 5);
                      cVar74 = *(char *)((long)*palVar17 + 6);
                      cVar76 = *(char *)((long)*palVar17 + 7);
                      cVar78 = (char)(*palVar17)[1];
                      cVar80 = *(char *)((long)*palVar17 + 9);
                      cVar82 = *(char *)((long)*palVar17 + 10);
                      cVar84 = *(char *)((long)*palVar17 + 0xb);
                      cVar86 = *(char *)((long)*palVar17 + 0xc);
                      cVar88 = *(char *)((long)*palVar17 + 0xd);
                      cVar90 = *(char *)((long)*palVar17 + 0xe);
                      cVar51 = *(char *)((long)*palVar17 + 0xf);
                      cVar60 = auVar58[0];
                      bVar33 = (cVar61 < cVar60) * cVar60 | (cVar61 >= cVar60) * cVar61;
                      cVar60 = auVar58[1];
                      bVar36 = (cVar64 < cVar60) * cVar60 | (cVar64 >= cVar60) * cVar64;
                      cVar60 = auVar58[2];
                      bVar37 = (cVar66 < cVar60) * cVar60 | (cVar66 >= cVar60) * cVar66;
                      cVar60 = auVar58[3];
                      bVar38 = (cVar68 < cVar60) * cVar60 | (cVar68 >= cVar60) * cVar68;
                      cVar60 = auVar58[4];
                      bVar39 = (cVar70 < cVar60) * cVar60 | (cVar70 >= cVar60) * cVar70;
                      cVar60 = auVar58[5];
                      bVar40 = (cVar72 < cVar60) * cVar60 | (cVar72 >= cVar60) * cVar72;
                      cVar60 = auVar58[6];
                      bVar41 = (cVar74 < cVar60) * cVar60 | (cVar74 >= cVar60) * cVar74;
                      cVar60 = auVar58[7];
                      bVar42 = (cVar76 < cVar60) * cVar60 | (cVar76 >= cVar60) * cVar76;
                      cVar60 = auVar58[8];
                      bVar43 = (cVar78 < cVar60) * cVar60 | (cVar78 >= cVar60) * cVar78;
                      cVar60 = auVar58[9];
                      bVar44 = (cVar80 < cVar60) * cVar60 | (cVar80 >= cVar60) * cVar80;
                      cVar60 = auVar58[10];
                      bVar45 = (cVar82 < cVar60) * cVar60 | (cVar82 >= cVar60) * cVar82;
                      cVar60 = auVar58[0xb];
                      bVar46 = (cVar84 < cVar60) * cVar60 | (cVar84 >= cVar60) * cVar84;
                      cVar60 = auVar58[0xc];
                      bVar47 = (cVar86 < cVar60) * cVar60 | (cVar86 >= cVar60) * cVar86;
                      cVar60 = auVar58[0xd];
                      bVar48 = (cVar88 < cVar60) * cVar60 | (cVar88 >= cVar60) * cVar88;
                      cVar60 = auVar58[0xe];
                      bVar49 = (cVar90 < cVar60) * cVar60 | (cVar90 >= cVar60) * cVar90;
                      cVar60 = auVar58[0xf];
                      bVar50 = (cVar51 < cVar60) * cVar60 | (cVar51 >= cVar60) * cVar51;
                      *(byte *)*palVar17 = bVar33;
                      *(byte *)((long)*palVar17 + 1) = bVar36;
                      *(byte *)((long)*palVar17 + 2) = bVar37;
                      *(byte *)((long)*palVar17 + 3) = bVar38;
                      *(byte *)((long)*palVar17 + 4) = bVar39;
                      *(byte *)((long)*palVar17 + 5) = bVar40;
                      *(byte *)((long)*palVar17 + 6) = bVar41;
                      *(byte *)((long)*palVar17 + 7) = bVar42;
                      *(byte *)(*palVar17 + 1) = bVar43;
                      *(byte *)((long)*palVar17 + 9) = bVar44;
                      *(byte *)((long)*palVar17 + 10) = bVar45;
                      *(byte *)((long)*palVar17 + 0xb) = bVar46;
                      *(byte *)((long)*palVar17 + 0xc) = bVar47;
                      *(byte *)((long)*palVar17 + 0xd) = bVar48;
                      *(byte *)((long)*palVar17 + 0xe) = bVar49;
                      *(byte *)((long)*palVar17 + 0xf) = bVar50;
                      bVar91 = ((char)bVar33 < (char)bVar91) * bVar33 |
                               ((char)bVar33 >= (char)bVar91) * bVar91;
                      bVar92 = ((char)bVar36 < (char)bVar92) * bVar36 |
                               ((char)bVar36 >= (char)bVar92) * bVar92;
                      bVar93 = ((char)bVar37 < (char)bVar93) * bVar37 |
                               ((char)bVar37 >= (char)bVar93) * bVar93;
                      bVar94 = ((char)bVar38 < (char)bVar94) * bVar38 |
                               ((char)bVar38 >= (char)bVar94) * bVar94;
                      bVar95 = ((char)bVar39 < (char)bVar95) * bVar39 |
                               ((char)bVar39 >= (char)bVar95) * bVar95;
                      bVar96 = ((char)bVar40 < (char)bVar96) * bVar40 |
                               ((char)bVar40 >= (char)bVar96) * bVar96;
                      bVar97 = ((char)bVar41 < (char)bVar97) * bVar41 |
                               ((char)bVar41 >= (char)bVar97) * bVar97;
                      bVar98 = ((char)bVar42 < (char)bVar98) * bVar42 |
                               ((char)bVar42 >= (char)bVar98) * bVar98;
                      bVar99 = ((char)bVar43 < (char)bVar99) * bVar43 |
                               ((char)bVar43 >= (char)bVar99) * bVar99;
                      bVar100 = ((char)bVar44 < (char)bVar100) * bVar44 |
                                ((char)bVar44 >= (char)bVar100) * bVar100;
                      bVar101 = ((char)bVar45 < (char)bVar101) * bVar45 |
                                ((char)bVar45 >= (char)bVar101) * bVar101;
                      bVar102 = ((char)bVar46 < (char)bVar102) * bVar46 |
                                ((char)bVar46 >= (char)bVar102) * bVar102;
                      bVar103 = ((char)bVar47 < (char)bVar103) * bVar47 |
                                ((char)bVar47 >= (char)bVar103) * bVar103;
                      bVar104 = ((char)bVar48 < (char)bVar104) * bVar48 |
                                ((char)bVar48 >= (char)bVar104) * bVar104;
                      bVar105 = ((char)bVar49 < (char)bVar105) * bVar49 |
                                ((char)bVar49 >= (char)bVar105) * bVar105;
                      bVar106 = ((char)bVar50 < (char)bVar106) * bVar50 |
                                ((char)bVar50 >= (char)bVar106) * bVar106;
                      cVar60 = auVar56[0];
                      cVar61 = auVar56[1];
                      cVar64 = auVar56[2];
                      cVar66 = auVar56[3];
                      cVar68 = auVar56[4];
                      cVar70 = auVar56[5];
                      cVar72 = auVar56[6];
                      cVar74 = auVar56[7];
                      cVar76 = auVar56[8];
                      cVar78 = auVar56[9];
                      cVar80 = auVar56[10];
                      cVar82 = auVar56[0xb];
                      cVar84 = auVar56[0xc];
                      cVar86 = auVar56[0xd];
                      cVar88 = auVar56[0xe];
                      cVar90 = auVar56[0xf];
                      vH_00[0] = uVar24 & 0xffffffff;
                      vH_00[1] = size;
                      arr_store_si128(((ppVar16->field_4).rowcols)->score_row,vH_00,t,s2Len,
                                      (int32_t)uVar29,(int32_t)ptr);
                      auVar56[1] = (cVar61 < (char)bVar36) * bVar36 |
                                   (cVar61 >= (char)bVar36) * cVar61;
                      auVar56[0] = (cVar60 < (char)bVar33) * bVar33 |
                                   (cVar60 >= (char)bVar33) * cVar60;
                      auVar56[2] = (cVar64 < (char)bVar37) * bVar37 |
                                   (cVar64 >= (char)bVar37) * cVar64;
                      auVar56[3] = (cVar66 < (char)bVar38) * bVar38 |
                                   (cVar66 >= (char)bVar38) * cVar66;
                      auVar56[4] = (cVar68 < (char)bVar39) * bVar39 |
                                   (cVar68 >= (char)bVar39) * cVar68;
                      auVar56[5] = (cVar70 < (char)bVar40) * bVar40 |
                                   (cVar70 >= (char)bVar40) * cVar70;
                      auVar56[6] = (cVar72 < (char)bVar41) * bVar41 |
                                   (cVar72 >= (char)bVar41) * cVar72;
                      auVar56[7] = (cVar74 < (char)bVar42) * bVar42 |
                                   (cVar74 >= (char)bVar42) * cVar74;
                      auVar56[8] = (cVar76 < (char)bVar43) * bVar43 |
                                   (cVar76 >= (char)bVar43) * cVar76;
                      auVar56[9] = (cVar78 < (char)bVar44) * bVar44 |
                                   (cVar78 >= (char)bVar44) * cVar78;
                      auVar56[10] = (cVar80 < (char)bVar45) * bVar45 |
                                    (cVar80 >= (char)bVar45) * cVar80;
                      auVar56[0xb] = (cVar82 < (char)bVar46) * bVar46 |
                                     (cVar82 >= (char)bVar46) * cVar82;
                      auVar56[0xc] = (cVar84 < (char)bVar47) * bVar47 |
                                     (cVar84 >= (char)bVar47) * cVar84;
                      auVar56[0xd] = (cVar86 < (char)bVar48) * bVar48 |
                                     (cVar86 >= (char)bVar48) * cVar86;
                      auVar56[0xe] = (cVar88 < (char)bVar49) * bVar49 |
                                     (cVar88 >= (char)bVar49) * cVar88;
                      auVar56[0xf] = (cVar90 < (char)bVar50) * bVar50 |
                                     (cVar90 >= (char)bVar50) * cVar90;
                      auVar9[1] = bVar36;
                      auVar9[0] = bVar33;
                      auVar9[2] = bVar37;
                      auVar9[3] = bVar38;
                      auVar9[4] = bVar39;
                      auVar9[5] = bVar40;
                      auVar9[6] = bVar41;
                      auVar9[7] = bVar42;
                      auVar9[8] = bVar43;
                      auVar9[9] = bVar44;
                      auVar9[10] = bVar45;
                      auVar9[0xb] = bVar46;
                      auVar9[0xc] = bVar47;
                      auVar9[0xd] = bVar48;
                      auVar9[0xe] = bVar49;
                      auVar9[0xf] = bVar50;
                      auVar108 = psubsb(auVar9,auVar53);
                      auVar58 = psubsb(auVar58,auVar54);
                      auVar34[0] = -(auVar108[0] < auVar58[0]);
                      auVar34[1] = -(auVar108[1] < auVar58[1]);
                      auVar34[2] = -(auVar108[2] < auVar58[2]);
                      auVar34[3] = -(auVar108[3] < auVar58[3]);
                      auVar34[4] = -(auVar108[4] < auVar58[4]);
                      auVar34[5] = -(auVar108[5] < auVar58[5]);
                      auVar34[6] = -(auVar108[6] < auVar58[6]);
                      auVar34[7] = -(auVar108[7] < auVar58[7]);
                      auVar34[8] = -(auVar108[8] < auVar58[8]);
                      auVar34[9] = -(auVar108[9] < auVar58[9]);
                      auVar34[10] = -(auVar108[10] < auVar58[10]);
                      auVar34[0xb] = -(auVar108[0xb] < auVar58[0xb]);
                      auVar34[0xc] = -(auVar108[0xc] < auVar58[0xc]);
                      auVar34[0xd] = -(auVar108[0xd] < auVar58[0xd]);
                      auVar34[0xe] = -(auVar108[0xe] < auVar58[0xe]);
                      bVar7 = auVar108[0xf] < auVar58[0xf];
                      auVar34[0xf] = -bVar7;
                      uVar24 = uVar24 + 1;
                      palVar17 = palVar17 + 1;
                      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar34 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar34 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar34 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar34 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar34 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar34 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar34 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar34 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar34 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar34 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          !bVar7) goto LAB_0066d09e;
                    }
                  }
LAB_0066d09e:
                  palVar17 = ptr_02 + uVar6;
                  cVar60 = (char)(*palVar17)[0];
                  cVar61 = *(char *)((long)*palVar17 + 1);
                  cVar64 = *(char *)((long)*palVar17 + 2);
                  cVar66 = *(char *)((long)*palVar17 + 3);
                  cVar68 = *(char *)((long)*palVar17 + 4);
                  cVar70 = *(char *)((long)*palVar17 + 5);
                  cVar72 = *(char *)((long)*palVar17 + 6);
                  cVar74 = *(char *)((long)*palVar17 + 7);
                  cVar76 = (char)(*palVar17)[1];
                  cVar78 = *(char *)((long)*palVar17 + 9);
                  cVar80 = *(char *)((long)*palVar17 + 10);
                  cVar82 = *(char *)((long)*palVar17 + 0xb);
                  cVar84 = *(char *)((long)*palVar17 + 0xc);
                  cVar86 = *(char *)((long)*palVar17 + 0xd);
                  cVar88 = *(char *)((long)*palVar17 + 0xe);
                  cVar90 = *(char *)((long)*palVar17 + 0xf);
                  local_68 = auVar57[0];
                  cStack_67 = auVar57[1];
                  cStack_66 = auVar57[2];
                  cStack_65 = auVar57[3];
                  cStack_64 = auVar57[4];
                  cStack_63 = auVar57[5];
                  cStack_62 = auVar57[6];
                  cStack_61 = auVar57[7];
                  cStack_60 = auVar57[8];
                  cStack_5f = auVar57[9];
                  cStack_5e = auVar57[10];
                  cStack_5d = auVar57[0xb];
                  cStack_5c = auVar57[0xc];
                  cStack_5b = auVar57[0xd];
                  cStack_5a = auVar57[0xe];
                  cStack_59 = auVar57[0xf];
                  auVar59[0] = -(local_68 < cVar60);
                  auVar59[1] = -(cStack_67 < cVar61);
                  auVar59[2] = -(cStack_66 < cVar64);
                  auVar59[3] = -(cStack_65 < cVar66);
                  auVar59[4] = -(cStack_64 < cVar68);
                  auVar59[5] = -(cStack_63 < cVar70);
                  auVar59[6] = -(cStack_62 < cVar72);
                  auVar59[7] = -(cStack_61 < cVar74);
                  auVar59[8] = -(cStack_60 < cVar76);
                  auVar59[9] = -(cStack_5f < cVar78);
                  auVar59[10] = -(cStack_5e < cVar80);
                  auVar59[0xb] = -(cStack_5d < cVar82);
                  auVar59[0xc] = -(cStack_5c < cVar84);
                  auVar59[0xd] = -(cStack_5b < cVar86);
                  auVar59[0xe] = -(cStack_5a < cVar88);
                  auVar59[0xf] = -(cStack_59 < cVar90);
                  auVar59 = auVar59 & local_d8;
                  if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar59 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar59 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar59 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar59 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar59 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar59 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar59 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar59 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar59 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar59 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar59 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar59[0xf] < '\0') {
                    iVar15 = t;
                  }
                  auVar57[0] = (local_68 < cVar60) * cVar60 | (local_68 >= cVar60) * local_68;
                  auVar57[1] = (cStack_67 < cVar61) * cVar61 | (cStack_67 >= cVar61) * cStack_67;
                  auVar57[2] = (cStack_66 < cVar64) * cVar64 | (cStack_66 >= cVar64) * cStack_66;
                  auVar57[3] = (cStack_65 < cVar66) * cVar66 | (cStack_65 >= cVar66) * cStack_65;
                  auVar57[4] = (cStack_64 < cVar68) * cVar68 | (cStack_64 >= cVar68) * cStack_64;
                  auVar57[5] = (cStack_63 < cVar70) * cVar70 | (cStack_63 >= cVar70) * cStack_63;
                  auVar57[6] = (cStack_62 < cVar72) * cVar72 | (cStack_62 >= cVar72) * cStack_62;
                  auVar57[7] = (cStack_61 < cVar74) * cVar74 | (cStack_61 >= cVar74) * cStack_61;
                  auVar57[8] = (cStack_60 < cVar76) * cVar76 | (cStack_60 >= cVar76) * cStack_60;
                  auVar57[9] = (cStack_5f < cVar78) * cVar78 | (cStack_5f >= cVar78) * cStack_5f;
                  auVar57[10] = (cStack_5e < cVar80) * cVar80 | (cStack_5e >= cVar80) * cStack_5e;
                  auVar57[0xb] = (cStack_5d < cVar82) * cVar82 | (cStack_5d >= cVar82) * cStack_5d;
                  auVar57[0xc] = (cStack_5c < cVar84) * cVar84 | (cStack_5c >= cVar84) * cStack_5c;
                  auVar57[0xd] = (cStack_5b < cVar86) * cVar86 | (cStack_5b >= cVar86) * cStack_5b;
                  auVar57[0xe] = (cStack_5a < cVar88) * cVar88 | (cStack_5a >= cVar88) * cStack_5a;
                  auVar57[0xf] = (cStack_59 < cVar90) * cVar90 | (cStack_59 >= cVar90) * cStack_59;
                  uVar26 = uVar26 + 1;
                  palVar17 = ptr;
                  ptr = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_sse41_128_8",pcVar18);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8(vH, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8 (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}